

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O1

void __thiscall Refal2::CFunctionBuilder::addRule(CFunctionBuilder *this)

{
  CRule *__ptr;
  CNodeType *pCVar1;
  CRule *pCVar2;
  CRule *pCVar3;
  
  if ((this->firstRule)._M_t.
      super___uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_>._M_t.
      super__Tuple_impl<0UL,_Refal2::CRule_*,_std::default_delete<Refal2::CRule>_>.
      super__Head_base<0UL,_Refal2::CRule_*,_false>._M_head_impl == (CRule *)0x0) {
    pCVar3 = (CRule *)operator_new(0x60);
    *(CNodeType **)((long)&(pCVar3->Left).super_CNodeList<Refal2::CUnit> + 8) = (CNodeType *)0x0;
    *(CNodeType **)((long)&(pCVar3->Left).super_CNodeList<Refal2::CUnit> + 0x10) = (CNodeType *)0x0;
    (pCVar3->Left).super_CNodeList<Refal2::CUnit>._vptr_CNodeList = &PTR__CNodeList_00148c80;
    *(CNodeType **)((long)&(pCVar3->Right).super_CNodeList<Refal2::CUnit> + 8) = (CNodeType *)0x0;
    *(CNodeType **)((long)&(pCVar3->Right).super_CNodeList<Refal2::CUnit> + 0x10) = (CNodeType *)0x0
    ;
    (pCVar3->Right).super_CNodeList<Refal2::CUnit>._vptr_CNodeList =
         (_func_int **)&PTR__CNodeList_00148c80;
    pCVar3->RightMatching = false;
    (pCVar3->Variables).variables = (CVariable *)0x0;
    (pCVar3->Variables).variablesSize = 0;
    (pCVar3->Variables).variablesValues = (TTableIndex *)0x0;
    (pCVar3->Variables).variablesValuesSize = 0;
    (pCVar3->NextRule)._M_t.
    super___uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_>._M_t =
         (tuple<Refal2::CRule_*,_std::default_delete<Refal2::CRule>_>)0x0;
    (this->firstRule)._M_t.super___uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_>
    ._M_t.super__Tuple_impl<0UL,_Refal2::CRule_*,_std::default_delete<Refal2::CRule>_>.
    super__Head_base<0UL,_Refal2::CRule_*,_false>._M_head_impl = pCVar3;
  }
  else {
    pCVar3 = this->lastRule;
    pCVar2 = (CRule *)operator_new(0x60);
    *(CNodeType **)((long)&(pCVar2->Left).super_CNodeList<Refal2::CUnit> + 8) = (CNodeType *)0x0;
    *(CNodeType **)((long)&(pCVar2->Left).super_CNodeList<Refal2::CUnit> + 0x10) = (CNodeType *)0x0;
    (pCVar2->Left).super_CNodeList<Refal2::CUnit>._vptr_CNodeList = &PTR__CNodeList_00148c80;
    *(CNodeType **)((long)&(pCVar2->Right).super_CNodeList<Refal2::CUnit> + 8) = (CNodeType *)0x0;
    *(CNodeType **)((long)&(pCVar2->Right).super_CNodeList<Refal2::CUnit> + 0x10) = (CNodeType *)0x0
    ;
    (pCVar2->Right).super_CNodeList<Refal2::CUnit>._vptr_CNodeList =
         (_func_int **)&PTR__CNodeList_00148c80;
    pCVar2->RightMatching = false;
    (pCVar2->Variables).variables = (CVariable *)0x0;
    (pCVar2->Variables).variablesSize = 0;
    (pCVar2->Variables).variablesValues = (TTableIndex *)0x0;
    (pCVar2->Variables).variablesValuesSize = 0;
    (pCVar2->NextRule)._M_t.
    super___uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_> =
         (__uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_>)0x0;
    __ptr = (pCVar3->NextRule)._M_t.
            super___uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_>._M_t.
            super__Tuple_impl<0UL,_Refal2::CRule_*,_std::default_delete<Refal2::CRule>_>.
            super__Head_base<0UL,_Refal2::CRule_*,_false>._M_head_impl;
    (pCVar3->NextRule)._M_t.
    super___uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_>._M_t.
    super__Tuple_impl<0UL,_Refal2::CRule_*,_std::default_delete<Refal2::CRule>_>.
    super__Head_base<0UL,_Refal2::CRule_*,_false>._M_head_impl = pCVar2;
    if (__ptr != (CRule *)0x0) {
      std::default_delete<Refal2::CRule>::operator()
                ((default_delete<Refal2::CRule> *)&pCVar3->NextRule,__ptr);
    }
    pCVar3 = (this->lastRule->NextRule)._M_t.
             super___uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_>._M_t.
             super__Tuple_impl<0UL,_Refal2::CRule_*,_std::default_delete<Refal2::CRule>_>.
             super__Head_base<0UL,_Refal2::CRule_*,_false>._M_head_impl;
  }
  this->lastRule = pCVar3;
  pCVar3 = this->lastRule;
  pCVar3->RightMatching = (bool)(this->super_CVariablesBuilder).field_0x1aad;
  if ((CRule *)&this->leftPart != pCVar3) {
    pCVar1 = (pCVar3->Left).super_CNodeList<Refal2::CUnit>.first;
    if (pCVar1 != (CNodeType *)0x0) {
      CNodeList<Refal2::CUnit>::Remove
                ((CNodeList<Refal2::CUnit> *)pCVar3,pCVar1,
                 (pCVar3->Left).super_CNodeList<Refal2::CUnit>.last);
    }
    (pCVar3->Left).super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
    (pCVar3->Left).super_CNodeList<Refal2::CUnit>.last = (CNodeType *)0x0;
    pCVar1 = (this->leftPart).super_CNodeList<Refal2::CUnit>.first;
    (this->leftPart).super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
    (pCVar3->Left).super_CNodeList<Refal2::CUnit>.first = pCVar1;
    pCVar1 = (this->leftPart).super_CNodeList<Refal2::CUnit>.last;
    (this->leftPart).super_CNodeList<Refal2::CUnit>.last =
         (pCVar3->Left).super_CNodeList<Refal2::CUnit>.last;
    (pCVar3->Left).super_CNodeList<Refal2::CUnit>.last = pCVar1;
  }
  pCVar3 = this->lastRule;
  if (&this->acc != &pCVar3->Right) {
    pCVar1 = (pCVar3->Right).super_CNodeList<Refal2::CUnit>.first;
    if (pCVar1 != (CNodeType *)0x0) {
      CNodeList<Refal2::CUnit>::Remove
                (&(pCVar3->Right).super_CNodeList<Refal2::CUnit>,pCVar1,
                 (pCVar3->Right).super_CNodeList<Refal2::CUnit>.last);
    }
    (pCVar3->Right).super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
    (pCVar3->Right).super_CNodeList<Refal2::CUnit>.last = (CNodeType *)0x0;
    pCVar1 = (this->acc).super_CNodeList<Refal2::CUnit>.first;
    (this->acc).super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
    (pCVar3->Right).super_CNodeList<Refal2::CUnit>.first = pCVar1;
    pCVar1 = (this->acc).super_CNodeList<Refal2::CUnit>.last;
    (this->acc).super_CNodeList<Refal2::CUnit>.last =
         (pCVar3->Right).super_CNodeList<Refal2::CUnit>.last;
    (pCVar3->Right).super_CNodeList<Refal2::CUnit>.last = pCVar1;
  }
  CVariablesBuilder::Export(&this->super_CVariablesBuilder,&this->lastRule->Variables);
  return;
}

Assistant:

void CFunctionBuilder::addRule()
{
	if( static_cast<bool>( firstRule ) ) {
		lastRule->NextRule.reset( new CRule );
		lastRule = lastRule->NextRule.get();
	} else {
		firstRule.reset( new CRule );
		lastRule = firstRule.get();
	}

	lastRule->RightMatching = isRightDirection;
	leftPart.Move( lastRule->Left );
	acc.Move( lastRule->Right );
	CVariablesBuilder::Export( lastRule->Variables );
}